

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O2

int FindUnixPipes(void)

{
  unixjob *puVar1;
  char *pcVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int i;
  long lVar6;
  
  UnixPID = -1;
  StartTime = -1;
  UnixPipeOut = -1;
  UnixPipeIn = -1;
  pcVar2 = getenv("LDEPIPEIN");
  if (pcVar2 != (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(pcVar2,(char **)0x0,10);
    if (*piVar3 == 0) {
      UnixPipeIn = (int)lVar4;
    }
  }
  pcVar2 = getenv("LDEPIPEOUT");
  if (pcVar2 != (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(pcVar2,(char **)0x0,10);
    if (*piVar3 == 0) {
      UnixPipeOut = (int)lVar4;
    }
  }
  pcVar2 = getenv("LDESTARTTIME");
  if (pcVar2 != (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(pcVar2,(char **)0x0,10);
    if (*piVar3 == 0) {
      StartTime = (long)(int)lVar4;
    }
  }
  pcVar2 = getenv("LDEUNIXPID");
  if (pcVar2 != (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(pcVar2,(char **)0x0,10);
    if (*piVar3 == 0) {
      UnixPID = (int)lVar4;
    }
  }
  uVar5 = sysconf(4);
  NPROCS = (int)uVar5;
  UJ = (unixjob *)malloc((long)NPROCS * 0x18);
  lVar4 = 0x10;
  for (lVar6 = 0; puVar1 = UJ, lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
    *(undefined8 *)((long)UJ + lVar4 + -0x10) = 0;
    *(undefined8 *)((long)puVar1 + lVar4 + -8) = 0xffffffff00000000;
    *(undefined4 *)((long)&puVar1->pathname + lVar4) = 0;
    uVar5 = (ulong)(uint)NPROCS;
    lVar4 = lVar4 + 0x18;
  }
  return (int)((UnixPID == -1 || StartTime == -1) || (UnixPipeOut == -1 || UnixPipeIn == -1));
}

Assistant:

int FindUnixPipes(void) {
  char *envtmp;
  int inttmp;
  struct unixjob cleareduj;

  DBPRINT(("Entering FindUnixPipes\n"));
  UnixPipeIn = UnixPipeOut = StartTime = UnixPID = -1;
  if ((envtmp = getenv("LDEPIPEIN"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPipeIn = inttmp;
  }
  if ((envtmp = getenv("LDEPIPEOUT"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPipeOut = inttmp;
  }
  if ((envtmp = getenv("LDESTARTTIME"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      StartTime = inttmp;
  }
  if ((envtmp = getenv("LDEUNIXPID"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPID = inttmp;
  }

/* This is a good place to initialize stuff like the UJ table */
  NPROCS = sysconf(_SC_OPEN_MAX);

  UJ = (struct unixjob *)malloc(NPROCS * sizeof(struct unixjob));
  cleareduj.status = -1;
  cleareduj.pathname = NULL;
  cleareduj.PID = 0;
  cleareduj.type = UJUNUSED;
  for (int i = 0; i < NPROCS; i++) UJ[i] = cleareduj;

  DBPRINT(("NPROCS is %d; leaving FindUnixPipes\n", NPROCS));
  return (UnixPipeIn == -1 || UnixPipeOut == -1 || StartTime == -1 || UnixPID == -1);
}